

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

Var Js::JavascriptExceptionOperators::StackTraceAccessor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  undefined1 uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  HRESULT HVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  Var pvVar10;
  RecyclableObject *obj;
  CompoundString *this;
  CompoundString *s;
  Type *this_00;
  FunctionBody *pFVar11;
  ScriptContext *pSVar12;
  LPCWSTR fileName;
  LPCWSTR pWVar13;
  void *__frameAddr;
  int in_stack_00000010;
  undefined1 local_c8 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  Var cache;
  CallInfo callInfo_local;
  ArgumentReader args;
  StackTrace *stackTrace;
  LPCWSTR functionName;
  undefined4 *local_68;
  ULONG local_60;
  LONG local_5c;
  ULONG lineNumber;
  LONG characterPosition;
  AutoNestedHandledExceptionType local_4c;
  RecyclableObject *pRStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  cache = (Var)callInfo;
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60e,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_0098dcca;
    *puVar9 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,(CallInfo *)&cache,(Var *)&stack0x00000018);
  if ((callInfo_local._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60f,"(args.Info.Count > 0)","Should always have implicit \'this\'");
    if (!bVar4) goto LAB_0098dcca;
    *puVar9 = 0;
  }
  pSVar12 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr;
  if (pSVar12 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x613,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_0098dcca;
    *puVar9 = 0;
  }
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar4 = VarIs<Js::RecyclableObject>(pvVar10);
  if (bVar4) {
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    obj = VarTo<Js::RecyclableObject>(pvVar10);
    if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
      __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
      __leaveScriptObject._36_4_ = 0;
      iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x14])
                        (obj,obj,6,&__leaveScriptObject.__exceptionCheck,0,pSVar12);
      this = (CompoundString *)__leaveScriptObject._32_8_;
      if (iVar5 == 0 || __leaveScriptObject._32_8_ == 0) {
        this = (CompoundString *)
               JavascriptLibrary::GetEmptyString
                         ((pSVar12->super_ScriptContextBase).javascriptLibrary);
        pRStack_48 = obj;
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (&local_4c,
                   ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                   ExceptionType_OutOfMemory);
        args.super_Arguments.Values = (Type)0x0;
        iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x14])
                          (obj,obj,5,&args.super_Arguments.Values,0,pSVar12);
        if ((iVar5 == 0) || (args.super_Arguments.Values == (Type)0x0)) {
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,this,0,0);
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
        }
        else {
          bVar4 = IsErrorInstance(obj);
          s = this;
          if (bVar4) {
            s = (CompoundString *)JavascriptConversion::ToString(obj,pSVar12);
          }
          functionName = (LPCWSTR)pSVar12;
          this = CompoundString::NewWithCharCapacity
                           (0x28,(pSVar12->super_ScriptContextBase).javascriptLibrary);
          CompoundString::AppendChars(this,(JavascriptString *)s);
          _lineNumber = s;
          local_68 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          for (iVar5 = 0; iVar5 < *(int *)(args.super_Arguments.Values + 2); iVar5 = iVar5 + 1) {
            this_00 = JsUtil::
                      List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item((List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              *)args.super_Arguments.Values,iVar5);
            bVar4 = JavascriptExceptionContext::StackFrame::IsScriptFunction(this_00);
            if (bVar4) {
              pFVar11 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00);
              pSVar12 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar11);
              if (pSVar12 == (ScriptContext *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *local_68 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                                   ,0x64e,"(funcScriptContext)","funcScriptContext");
                if (!bVar4) goto LAB_0098dcca;
                *local_68 = 0;
              }
              if (((ScriptContext *)functionName == pSVar12) ||
                 (iVar6 = (**(code **)(**(long **)(functionName + 0x97c) + 0x40))
                                    (*(long **)(functionName + 0x97c),pSVar12), -1 < iVar6))
              goto LAB_0098d9d7;
            }
            else {
LAB_0098d9d7:
              pFVar11 = JavascriptExceptionContext::StackFrame::GetFunctionBody(this_00);
              if ((pFVar11 == (FunctionBody *)0x0) ||
                 ((((pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)
                   ->field_0xa8 & 4) != 0)) {
                pWVar13 = JavascriptExceptionContext::StackFrame::GetFunctionName(this_00);
                AppendLibraryFrameToStackTrace(this,pWVar13);
              }
              else {
                local_60 = 0;
                local_5c = 0;
                FunctionBody::GetLineCharOffset
                          (pFVar11,(this_00->field_1).byteCodeOffset,&local_60,&local_5c,true);
                fileName = ParseableFunctionInfo::GetSourceName
                                     (&pFVar11->super_ParseableFunctionInfo);
                pWVar13 = functionName;
                stackTrace = (StackTrace *)0x0;
                if (DAT_01459495 == '\x01') {
                  LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                            ((LeaveScriptObject<true,_false,_false> *)local_c8,
                             (ScriptContext *)functionName,&stack0xfffffffffffffff8);
                  lVar2 = *(long *)(pWVar13 + 0x1dc);
                  uVar1 = *(undefined1 *)(lVar2 + 0x109);
                  *(undefined1 *)(lVar2 + 0x109) = 1;
                  HVar7 = JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
                                    (this_00,(LPCWSTR *)&stackTrace);
                  if (HVar7 != 0) {
                    stackTrace = (StackTrace *)
                                 ParseableFunctionInfo::GetExternalDisplayName
                                           (&pFVar11->super_ParseableFunctionInfo);
                  }
                  ThreadContext::DisposeOnLeaveScript(*(ThreadContext **)(functionName + 0x1dc));
                  *(undefined1 *)(lVar2 + 0x109) = uVar1;
                  LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                            ((LeaveScriptObject<true,_false,_false> *)local_c8);
                  obj = pRStack_48;
                }
                else {
                  stackTrace = (StackTrace *)
                               ParseableFunctionInfo::GetExternalDisplayName
                                         (&pFVar11->super_ParseableFunctionInfo);
                }
                if (fileName == (LPCWSTR)0x0) {
                  fileName = L"";
                }
                AppendExternalFrameToStackTrace
                          (this,(LPCWSTR)stackTrace,fileName,local_60 + 1,local_5c + 1);
              }
            }
          }
          BVar8 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
          if (BVar8 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_68 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                               ,0x67c,
                               "(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                               "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
            if (!bVar4) {
LAB_0098dcca:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *local_68 = 0;
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
          (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x19])(obj,6,this,0,0);
        }
      }
    }
    else {
      pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(obj,6,pvVar10,0,0);
      bVar4 = VarIsImpl<Js::JavascriptError>(obj);
      if (bVar4) {
        *(undefined1 *)((long)&obj[2].type.ptr + 4) = 1;
      }
      this = (CompoundString *)
             JavascriptLibrary::GetEmptyString((pSVar12->super_ScriptContextBase).javascriptLibrary)
      ;
    }
  }
  else {
    this = (CompoundString *)
           (((pSVar12->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  }
  return this;
}

Assistant:

Var JavascriptExceptionOperators::StackTraceAccessor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext *scriptContext = function->GetScriptContext();

        AnalysisAssert(scriptContext);

        // If the first argument to the accessor is not a recyclable object, return undefined
        // for compat with other browsers
        if (!VarIs<RecyclableObject>(args[0]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *obj = VarTo<RecyclableObject>(args[0]);

        // If an argument was passed to the accessor, it is being called as a setter.
        // Set the internal StackTraceCache property accordingly.
        if (args.Info.Count > 1)
        {
            obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, args[1], PropertyOperationFlags::PropertyOperation_None, NULL);
            if (VarIs<JavascriptError>(obj))
            {
                ((JavascriptError *)obj)->SetStackPropertyRedefined(true);
            }
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Otherwise, the accessor is being called as a getter.
        // Return existing cached value, or obtain the string representation of the StackTrace to return.
        Var cache = NULL;
        if (obj->GetInternalProperty(obj,InternalPropertyIds::StackTraceCache, (Var*)&cache, NULL, scriptContext) && cache)
        {
            return cache;
        }

        JavascriptString* stringMessage = scriptContext->GetLibrary()->GetEmptyString();
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            Js::JavascriptExceptionContext::StackTrace *stackTrace = NULL;
            if (!obj->GetInternalProperty(obj,InternalPropertyIds::StackTrace, (Js::Var*) &stackTrace, NULL, scriptContext) ||
                stackTrace == nullptr)
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, stringMessage, PropertyOperationFlags::PropertyOperation_None, NULL);
                return stringMessage;
            }

            if (IsErrorInstance(obj))
            {
                stringMessage = JavascriptConversion::ToString(obj, scriptContext);
            }

            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendChars(stringMessage);

            for (int i = 0; i < stackTrace->Count(); i++)
            {
                Js::JavascriptExceptionContext::StackFrame& currentFrame = stackTrace->Item(i);

                // Defend in depth. Discard cross domain frames if somehow they creped in.
                if (currentFrame.IsScriptFunction())
                {
                    ScriptContext* funcScriptContext = currentFrame.GetFunctionBody()->GetScriptContext();
                    AnalysisAssert(funcScriptContext);
                    if (scriptContext != funcScriptContext && FAILED(scriptContext->GetHostScriptContext()->CheckCrossDomainScriptContext(funcScriptContext)))
                    {
                        continue; // Ignore this frame
                    }
                }

                FunctionBody* functionBody = currentFrame.GetFunctionBody();
                const bool isLibraryCode = !functionBody || functionBody->GetUtf8SourceInfo()->GetIsLibraryCode();
                if (isLibraryCode)
                {
                    AppendLibraryFrameToStackTrace(stringBuilder, currentFrame.GetFunctionName());
                }
                else
                {
                    LPCWSTR pUrl = NULL;
                    ULONG lineNumber = 0;
                    LONG characterPosition = 0;

                    functionBody->GetLineCharOffset(currentFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
                    pUrl = functionBody->GetSourceName();
                    LPCWSTR functionName = nullptr;
                    if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
                    {
                        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext)
                        {
                            if (currentFrame.GetFunctionNameWithArguments(&functionName) != S_OK)
                            {
                                functionName = functionBody->GetExternalDisplayName();
                            }
                        }
                        END_LEAVE_SCRIPT_INTERNAL(scriptContext)
                    }
                    else
                    {
                        functionName = functionBody->GetExternalDisplayName();
                    }
                    AppendExternalFrameToStackTrace(stringBuilder, functionName, pUrl ? pUrl : _u(""), lineNumber + 1, characterPosition + 1);
                }
            }

            // Try to create the string object even if we did OOM, but if can't, just return what we've got. We catch and ignore OOM so it doesn't propagate up.
            // With all the stack trace functionality, we do best effort to produce the stack trace in the case of OOM, but don't want it to trigger an OOM. Idea is if do take
            // an OOM, have some chance of producing a stack trace to see where it happened.
            stringMessage = stringBuilder;
        }